

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

uint128 __thiscall absl::anon_unknown_0::MakeU128Ticks(anon_unknown_0 *this,Duration d)

{
  uint32_t *this_00;
  undefined8 extraout_RDX;
  Duration d_00;
  Duration d_01;
  uint128 local_78;
  uint128 local_68;
  int64_t local_58;
  undefined8 local_50;
  uint32_t local_44;
  anon_unknown_0 *paStack_40;
  uint32_t rep_lo;
  uint local_38;
  unsigned_long local_30;
  int64_t rep_hi;
  Duration d_local;
  uint128 u128;
  
  d_01.rep_lo_ = (uint)d.rep_hi_;
  d_01.rep_hi_ = (int64_t)this;
  d_01._12_4_ = 0;
  paStack_40 = this;
  local_38 = d_01.rep_lo_;
  rep_hi = (int64_t)this;
  d_local.rep_hi_._0_4_ = d_01.rep_lo_;
  local_30 = time_internal::GetRepHi(d_01);
  local_58 = rep_hi;
  local_50 = CONCAT44(d_local.rep_hi_._4_4_,(uint)d_local.rep_hi_);
  d_00._8_8_ = extraout_RDX;
  d_00.rep_hi_ = (ulong)(uint)d_local.rep_hi_;
  local_44 = time_internal::GetRepLo((time_internal *)rep_hi,d_00);
  if ((long)local_30 < 0) {
    local_30 = -(local_30 + 1);
    local_44 = 4000000000 - local_44;
  }
  this_00 = &d_local.rep_lo_;
  uint128::uint128((uint128 *)this_00,local_30);
  uint128::uint128(&local_68,4000000000);
  uint128::operator*=((uint128 *)this_00,local_68);
  uint128::uint128(&local_78,local_44);
  uint128::operator+=((uint128 *)this_00,local_78);
  return stack0xffffffffffffffe8;
}

Assistant:

inline uint128 MakeU128Ticks(Duration d) {
  int64_t rep_hi = time_internal::GetRepHi(d);
  uint32_t rep_lo = time_internal::GetRepLo(d);
  if (rep_hi < 0) {
    ++rep_hi;
    rep_hi = -rep_hi;
    rep_lo = kTicksPerSecond - rep_lo;
  }
  uint128 u128 = static_cast<uint64_t>(rep_hi);
  u128 *= static_cast<uint64_t>(kTicksPerSecond);
  u128 += rep_lo;
  return u128;
}